

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Pseudo * linearize_concat_expression(Proc *proc,AstNode *expr)

{
  PtrList *head;
  long lVar1;
  long lVar2;
  int iVar3;
  Instruction *insn_00;
  Pseudo *pseudo;
  Pseudo *pPVar4;
  Pseudo *apPStack_a0 [3];
  Pseudo *tofree_1;
  Pseudo *op;
  Pseudo *tofree;
  Pseudo *operand;
  PtrListIterator niter__;
  int i;
  Pseudo **operands;
  Pseudo **tofreelist;
  AstNode *pAStack_38;
  int N;
  AstNode *n;
  Pseudo *target;
  ravitype_t target_type;
  Instruction *insn;
  AstNode *expr_local;
  Proc *proc_local;
  
  apPStack_a0[0] = (Pseudo *)0x124d68;
  insn_00 = allocate_instruction(proc,op_concat,expr->line_number);
  apPStack_a0[0] = (Pseudo *)0x124d87;
  pseudo = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
  apPStack_a0[0] = (Pseudo *)0x124d98;
  iVar3 = raviX_ptrlist_size((PtrList *)(expr->field_2).function_stmt.function_expr);
  lVar1 = -0x98 - ((long)iVar3 * 8 + 0xfU & 0xfffffffffffffff0);
  lVar2 = lVar1 - ((long)iVar3 * 8 + 0xfU & 0xfffffffffffffff0);
  niter__._20_4_ = 0;
  head = (PtrList *)(expr->field_2).function_stmt.function_expr;
  *(undefined8 *)((long)apPStack_a0 + lVar2 + 0x98) = 0x124ded;
  raviX_ptrlist_forward_iterator((PtrListIterator *)&operand,head);
  *(undefined8 *)((long)apPStack_a0 + lVar2 + 0x98) = 0x124df6;
  pAStack_38 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)&operand);
  while (pAStack_38 != (AstNode *)0x0) {
    *(undefined8 *)((long)apPStack_a0 + lVar2 + 0x98) = 0x124e0e;
    pPVar4 = linearize_expression(proc,pAStack_38);
    tofree = pPVar4;
    *(undefined8 *)((long)apPStack_a0 + lVar2 + 0x98) = 0x124e23;
    op = add_instruction_operand(proc,insn_00,pPVar4);
    *(Pseudo **)((long)apPStack_a0 + (long)(int)niter__._20_4_ * 8 + lVar1 + 0xa0) = op;
    *(Pseudo **)((long)apPStack_a0 + (long)(int)niter__._20_4_ * 8 + lVar2 + 0xa0) = tofree;
    niter__._20_4_ = niter__._20_4_ + 1;
    *(undefined8 *)((long)apPStack_a0 + lVar2 + 0x98) = 0x124e59;
    pAStack_38 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)&operand);
  }
  *(undefined8 *)((long)apPStack_a0 + lVar2 + 0x98) = 0x124e70;
  add_instruction_target(proc,insn_00,pseudo);
  *(undefined8 *)((long)apPStack_a0 + lVar2 + 0x98) = 0x124e7d;
  add_instruction(proc,insn_00);
  for (niter__._20_4_ = 0; (int)niter__._20_4_ < iVar3; niter__._20_4_ = niter__._20_4_ + 1) {
    pPVar4 = *(Pseudo **)((long)apPStack_a0 + (long)(int)niter__._20_4_ * 8 + lVar2 + 0xa0);
    tofree_1 = pPVar4;
    *(undefined8 *)((long)apPStack_a0 + lVar2 + 0x98) = 0x124eab;
    free_temp_pseudo(proc,pPVar4,false);
    pPVar4 = *(Pseudo **)((long)apPStack_a0 + (long)(int)niter__._20_4_ * 8 + lVar1 + 0xa0);
    apPStack_a0[2] = pPVar4;
    if (pPVar4 != (Pseudo *)0x0) {
      *(undefined8 *)((long)apPStack_a0 + lVar2 + 0x98) = 0x124eda;
      free_temp_pseudo(proc,pPVar4,false);
    }
  }
  return pseudo;
}

Assistant:

static Pseudo *linearize_concat_expression(Proc *proc, AstNode *expr)
{
	Instruction *insn = allocate_instruction(proc, op_concat, expr->line_number);
	ravitype_t target_type = expr->string_concatenation_expr.type.type_code;
	Pseudo *target = allocate_temp_pseudo(proc, target_type, true);
	AstNode *n;
	int N = raviX_ptrlist_size((const PtrList *) expr->string_concatenation_expr.expr_list);
	Pseudo **tofreelist = (Pseudo **)alloca( N* sizeof(Pseudo *));
	Pseudo **operands = (Pseudo **)alloca( N * sizeof(Pseudo *));
	int i = 0;
	FOR_EACH_PTR(expr->string_concatenation_expr.expr_list, AstNode, n) {
		Pseudo *operand = linearize_expression(proc, n);
		Pseudo *tofree =  add_instruction_operand(proc, insn, operand);
		tofreelist[i] = tofree;
		operands[i] = operand;
		i++;
	}
	END_FOR_EACH_PTR(n)
	add_instruction_target(proc, insn, target);
	add_instruction(proc, insn);
	for (i=0; i < N; i++) {
		Pseudo *op = operands[i];
		free_temp_pseudo(proc, op, false);
		Pseudo *tofree = tofreelist[i];
		if (tofree)
			free_temp_pseudo(proc, tofree, false);
	}
	return target;
}